

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_sptfqmr.c
# Opt level: O0

int SUNLinSolSetPreconditioner_SPTFQMR
              (SUNLinearSolver S,void *PData,PSetupFn Psetup,PSolveFn Psolve)

{
  PSolveFn Psolve_local;
  PSetupFn Psetup_local;
  void *PData_local;
  SUNLinearSolver S_local;
  
  if (S == (SUNLinearSolver)0x0) {
    S_local._4_4_ = -1;
  }
  else {
    *(PSetupFn *)((long)S->content + 0x30) = Psetup;
    *(PSolveFn *)((long)S->content + 0x38) = Psolve;
    *(void **)((long)S->content + 0x40) = PData;
    *(undefined8 *)((long)S->content + 0x18) = 0;
    S_local._4_4_ = (int)*(undefined8 *)((long)S->content + 0x18);
  }
  return S_local._4_4_;
}

Assistant:

int SUNLinSolSetPreconditioner_SPTFQMR(SUNLinearSolver S, void* PData,
                                       PSetupFn Psetup, PSolveFn Psolve)
{
  /* set function pointers to integrator-supplied Psetup and PSolve
     routines and data, and return with success */
  if (S == NULL) return(SUNLS_MEM_NULL);
  SPTFQMR_CONTENT(S)->Psetup = Psetup;
  SPTFQMR_CONTENT(S)->Psolve = Psolve;
  SPTFQMR_CONTENT(S)->PData = PData;
  LASTFLAG(S) = SUNLS_SUCCESS;
  return(LASTFLAG(S));
}